

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

void * hugeOpen(char *URI)

{
  int iVar1;
  size_t sVar2;
  int local_1c;
  int i;
  char *URI_local;
  
  if (URI != (char *)0x0) {
    local_1c = 0;
    while (hugeDocTable[local_1c].URL != (char *)0x0) {
      iVar1 = strcmp(URI,hugeDocTable[local_1c].URL);
      if (iVar1 == 0) {
        hugeDocParts = hugeDocTable + local_1c;
        curseg = 0;
        current = hugeDocTable[local_1c].start;
        sVar2 = strlen(current);
        rlen = (int)sVar2;
        return current;
      }
      local_1c = local_1c + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
hugeOpen(const char * URI) {
    int i;

    if (URI == NULL)
        return(NULL);

    for (i = 0; hugeDocTable[i].URL; i++) {
        if (strcmp(URI, hugeDocTable[i].URL) == 0) {
            hugeDocParts = hugeDocTable + i;
            curseg = 0;
            current = hugeDocParts->start;
            rlen = strlen(current);
            return((void *) current);
        }
    }

    return(NULL);
}